

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O2

int __thiscall tsip::update_report(tsip *this)

{
  byte *pbVar1;
  UINT8 UVar2;
  ushort uVar3;
  ushort uVar4;
  undefined2 uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  UINT32 UVar9;
  int k;
  long lVar10;
  SINGLE SVar11;
  DOUBLE DVar12;
  
  if (this->verbose == true) {
    printf("Found Report: %x-%x\n",(ulong)(this->m_report).raw.data[0],
           (ulong)(this->m_report).raw.data[1]);
  }
  UVar2 = (this->m_report).raw.data[0];
  switch(UVar2) {
  case 'B':
    *(byte *)&this->m_updated = *(byte *)&this->m_updated | 1;
    (this->m_ecef_position_s).valid = true;
    uVar6 = *(uint *)((long)&this->m_report + 2);
    uVar7 = *(uint *)((long)&this->m_report + 6);
    (this->m_ecef_position_s).report.x =
         (float)(int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18);
    (this->m_ecef_position_s).report.y =
         (float)(int)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 |
                     uVar7 << 0x18);
    uVar6 = *(uint *)((long)&this->m_report + 10);
    (this->m_ecef_position_s).report.z =
         (float)(int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18);
    uVar6 = *(uint *)((long)&this->m_report + 0xe);
    (this->m_ecef_position_s).report.time_of_fix =
         (float)(int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                     uVar6 << 0x18);
    break;
  case 'C':
    *(byte *)&this->m_updated = *(byte *)&this->m_updated | 4;
    (this->m_ecef_velocity).valid = true;
    break;
  case 'E':
    *(byte *)&this->m_updated = *(byte *)&this->m_updated | 8;
    (this->m_sw_version).valid = true;
    break;
  case 'J':
    *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x10;
    (this->m_single_position).valid = true;
    break;
  default:
    if (UVar2 == 'U') {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x40;
      (this->m_io_options).valid = true;
      break;
    }
    if (UVar2 == 'V') {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x80;
      (this->m_enu_velocity).valid = true;
      break;
    }
    if (UVar2 == 0x83) {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 2;
      (this->m_ecef_position_d).valid = true;
      break;
    }
    if (UVar2 == 0x84) {
      *(byte *)&this->m_updated = *(byte *)&this->m_updated | 0x20;
      (this->m_double_position).valid = true;
      break;
    }
    if (UVar2 == 0x8f) {
      UVar2 = (this->m_report).raw.data[1];
      uVar3 = *(ushort *)&this->m_updated;
      if (UVar2 == 0xac) {
        *(ushort *)&this->m_updated = uVar3 | 0x200;
        (this->m_secondary_time).valid = true;
        (this->m_secondary_time).report.receiver_mode = (this->m_report).raw.data[2];
        uVar5 = *(undefined2 *)((long)&this->m_report + 3);
        (this->m_secondary_time).report.disciplining_mode = (char)uVar5;
        (this->m_secondary_time).report.self_survey_progress = (char)((ushort)uVar5 >> 8);
        UVar9 = b4_to_uint32(this,3,'e');
        (this->m_secondary_time).report.holdover_duration = UVar9;
        uVar3 = *(ushort *)((long)&this->m_report + 9);
        uVar4 = *(ushort *)((long)&this->m_report + 0xb);
        (this->m_secondary_time).report.critical_alarms.value = uVar3 << 8 | uVar3 >> 8;
        (this->m_secondary_time).report.minor_alarms.value = uVar4 << 8 | uVar4 >> 8;
        uVar8 = *(undefined4 *)((long)&this->m_report + 0xd);
        (this->m_secondary_time).report.gps_decoding_status = (char)uVar8;
        (this->m_secondary_time).report.disciplining_activity = (char)((uint)uVar8 >> 8);
        (this->m_secondary_time).report.spare_status1 = (char)((uint)uVar8 >> 0x10);
        (this->m_secondary_time).report.spare_status2 = (char)((uint)uVar8 >> 0x18);
        SVar11 = b4_to_single(this,0xf,'e');
        (this->m_secondary_time).report.pps_offset = SVar11;
        SVar11 = b4_to_single(this,0x13,'e');
        (this->m_secondary_time).report.tenMHz_offset = SVar11;
        UVar9 = b4_to_uint32(this,0x17,'e');
        (this->m_secondary_time).report.dac_value = UVar9;
        SVar11 = b4_to_single(this,0x1b,'e');
        (this->m_secondary_time).report.dac_voltage = SVar11;
        SVar11 = b4_to_single(this,0x1f,'e');
        (this->m_secondary_time).report.temperature = SVar11;
        DVar12 = b8_to_double(this,0x23,'e');
        (this->m_secondary_time).report.latitude = DVar12;
        DVar12 = b8_to_double(this,0x2b,'e');
        (this->m_secondary_time).report.longitude = DVar12;
        DVar12 = b8_to_double(this,0x33,'e');
        (this->m_secondary_time).report.altitude = DVar12;
        *(undefined8 *)(this->m_secondary_time).report.spare =
             *(undefined8 *)((long)&this->m_report + 0x3d);
      }
      else if (UVar2 == 0xab) {
        *(ushort *)&this->m_updated = uVar3 | 0x100;
        (this->m_primary_time).valid = true;
        UVar9 = b4_to_uint32(this,0,'e');
        (this->m_primary_time).report.seconds_of_week = UVar9;
        uVar3 = *(ushort *)((long)&this->m_report + 6);
        uVar4 = *(ushort *)((long)&this->m_report + 8);
        (this->m_primary_time).report.week_number = uVar3 << 8 | uVar3 >> 8;
        (this->m_primary_time).report.utc_offset = uVar4 << 8 | uVar4 >> 8;
        uVar8 = *(undefined4 *)((long)&this->m_report + 10);
        (this->m_primary_time).report.flags = (_flags)(char)uVar8;
        (this->m_primary_time).report.seconds = (char)((uint)uVar8 >> 8);
        (this->m_primary_time).report.minutes = (char)((uint)uVar8 >> 0x10);
        (this->m_primary_time).report.hours = (char)((uint)uVar8 >> 0x18);
        uVar5 = *(undefined2 *)((long)&this->m_report + 0xe);
        (this->m_primary_time).report.day = (char)uVar5;
        (this->m_primary_time).report.month = (char)((ushort)uVar5 >> 8);
        uVar3 = *(ushort *)((long)&this->m_report + 0x10);
        (this->m_primary_time).report.year = uVar3 << 8 | uVar3 >> 8;
      }
      else if (UVar2 == 0xa2) {
        *(ushort *)&this->m_updated = uVar3 | 0x400;
        (this->m_utc_gps_time).valid = true;
        (this->m_utc_gps_time).report.bits = *(_flags *)((this->m_report).raw.data + 2);
      }
      else {
        *(ushort *)&this->m_updated = uVar3 | 0x8000;
      }
    }
  case 'D':
  case 'F':
  case 'G':
  case 'H':
  case 'I':
    pbVar1 = (byte *)((long)&this->m_updated + 1);
    *pbVar1 = *pbVar1 | 0x80;
    (this->m_unknown).valid = true;
  }
  if (this->debug == true) {
    puts("command buffer:");
    for (lVar10 = -0x18; lVar10 != 0; lVar10 = lVar10 + 1) {
      printf(" %x",(ulong)*(byte *)((long)&this->m_command + lVar10 + 0x18));
    }
    putchar(10);
    puts("\nreport buffer:");
    for (lVar10 = 0; lVar10 < this->m_report_length; lVar10 = lVar10 + 1) {
      printf(" %x",(ulong)*(byte *)((long)&this->m_report + lVar10));
    }
    putchar(10);
  }
  return 1;
}

Assistant:

int tsip::update_report()
{
	void *src;
	void *dst;
	int  rlen = 0;

	if (verbose) printf("Found Report: %x-%x\n",m_report.report.code,m_report.extended.subcode);
	// save report
	switch (m_report.report.code) {

	case REPORT_ECEF_POSITION_S:
		m_updated.report.ecef_position_s = 1;
		m_ecef_position_s.valid = true;
		rlen = sizeof(m_ecef_position_s.report);

		m_ecef_position_s.report.x = (m_report.extended.data[0] << 24) + (m_report.extended.data[1] << 16) + (m_report.extended.data[2] << 8) + m_report.extended.data[3];
		m_ecef_position_s.report.y = (m_report.extended.data[4] << 24) + (m_report.extended.data[5] << 16) + (m_report.extended.data[6] << 8) + m_report.extended.data[7];
		m_ecef_position_s.report.z = (m_report.extended.data[8] << 24) + (m_report.extended.data[9] << 16) + (m_report.extended.data[10] << 8) + m_report.extended.data[11];
		m_ecef_position_s.report.time_of_fix = (m_report.extended.data[12] << 24) + (m_report.extended.data[13] << 16) + (m_report.extended.data[14] << 8) + m_report.extended.data[15];

		break;

	case REPORT_ECEF_POSITION_D:
		m_updated.report.ecef_position_d = 1;
		m_ecef_position_d.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_position_d.report;
		rlen = sizeof(m_ecef_position_d.report);
		break;

	case REPORT_ECEF_VELOCITY:
		m_updated.report.ecef_velocity = 1;
		m_ecef_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_ecef_velocity.report;
		rlen = sizeof(m_ecef_velocity.report);
		break;

	case REPORT_SW_VERSION:
		m_updated.report.sw_version = 1;
		m_sw_version.valid = true;
		src = m_report.report.data;
		dst = &m_sw_version.report;
		rlen = sizeof(m_sw_version.report);
		break;

	case REPORT_SINGLE_POSITION:
		m_updated.report.single_position = 1;
		m_single_position.valid = true;
		src = m_report.report.data;
		dst = &m_single_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_DOUBLE_POSITION:
		m_updated.report.double_position = 1;
		m_double_position.valid = true;
		src = m_report.report.data;
		dst = &m_double_position.report;
		rlen = sizeof(m_single_position.report);
		break;

	case REPORT_IO_OPTIONS:
		m_updated.report.io_options = 1;
		m_io_options.valid = true;
		src = m_report.report.data;
		dst = &m_io_options.report;
		rlen = sizeof(m_io_options.report);
		break;

	case REPORT_ENU_VELOCITY:
		m_updated.report.enu_velocity = 1;
		m_enu_velocity.valid = true;
		src = m_report.report.data;
		dst = &m_enu_velocity.report;
		rlen = sizeof(m_enu_velocity.report);
		break;

	case REPORT_SUPER:
		switch (m_report.extended.subcode) {

		// 8f-a2
		case REPORT_SUPER_UTC_GPS_TIME:
			m_updated.report.utc_gps_time = 1;
			m_utc_gps_time.valid = true;
			rlen = sizeof(m_utc_gps_time.report);

			m_utc_gps_time.report.bits.value = m_report.extended.data[0];
			break;

		// 8f-ab
		case REPORT_SUPER_PRIMARY_TIME:
			m_updated.report.primary_time = 1;
			m_primary_time.valid = true;
			rlen = sizeof(m_primary_time.report);

			m_primary_time.report.seconds_of_week = b4_to_uint32(0,'e');
			m_primary_time.report.week_number = b2_to_uint16(4,'e');
			m_primary_time.report.utc_offset = b2_to_uint16(6,'e');
			m_primary_time.report.flags.value = m_report.extended.data[8];
			m_primary_time.report.seconds = m_report.extended.data[9];
			m_primary_time.report.minutes = m_report.extended.data[10];
			m_primary_time.report.hours = m_report.extended.data[11];
			m_primary_time.report.day = m_report.extended.data[12];
			m_primary_time.report.month = m_report.extended.data[13];
			m_primary_time.report.year = b2_to_uint16(14,'e');

			break;

		// 8f-ac
		case REPORT_SUPER_SECONDARY_TIME:
			m_updated.report.secondary_time = 1;
			m_secondary_time.valid = true;
			rlen = sizeof(m_secondary_time.report);

			m_secondary_time.report.receiver_mode = m_report.extended.data[0];
			m_secondary_time.report.disciplining_mode = m_report.extended.data[1];
			m_secondary_time.report.self_survey_progress = m_report.extended.data[2];
			m_secondary_time.report.holdover_duration = b4_to_uint32(3,'e');
			m_secondary_time.report.critical_alarms.value = b2_to_uint16(7,'e');
			m_secondary_time.report.minor_alarms.value = b2_to_uint16(9,'e');;
			m_secondary_time.report.gps_decoding_status = m_report.extended.data[11];
			m_secondary_time.report.disciplining_activity = m_report.extended.data[12];
			m_secondary_time.report.spare_status1 = m_report.extended.data[13];
			m_secondary_time.report.spare_status2 = m_report.extended.data[14];

			m_secondary_time.report.pps_offset = b4_to_single(15,'e');
			m_secondary_time.report.tenMHz_offset = b4_to_single(19,'e');
			m_secondary_time.report.dac_value = b4_to_uint32(23,'e');
			m_secondary_time.report.dac_voltage = b4_to_single(27,'e');
			m_secondary_time.report.temperature = b4_to_single(31,'e');

			m_secondary_time.report.latitude = b8_to_double(35,'e');
			m_secondary_time.report.longitude = b8_to_double(43,'e');
			m_secondary_time.report.altitude = b8_to_double(51,'e');

			m_secondary_time.report.spare[0] = m_report.extended.data[59];
			m_secondary_time.report.spare[1] = m_report.extended.data[60];
			m_secondary_time.report.spare[2] = m_report.extended.data[61];
			m_secondary_time.report.spare[3] = m_report.extended.data[62];
			m_secondary_time.report.spare[4] = m_report.extended.data[63];
			m_secondary_time.report.spare[5] = m_report.extended.data[64];
			m_secondary_time.report.spare[6] = m_report.extended.data[65];
			m_secondary_time.report.spare[7] = m_report.extended.data[66];
			break;

		default:
			m_updated.report.unknown = 1;
			m_unknown.valid = true;
		    src = m_report.raw.data;
			dst = m_unknown.report.raw.data;
			rlen = sizeof(m_unknown.report.raw.data);
			break;
		}

	default:
		m_updated.report.unknown = 1;
		m_unknown.valid = true;
	    src = m_report.raw.data;
		dst = m_unknown.report.raw.data;
		rlen = sizeof(m_unknown.report.raw.data);
        break;
	}

	// report strucute updated
	if (rlen > 0 ) {
		if (debug) {
			printf("command buffer:\n");
			for (int k=0;k<24;k++){printf(" %x",m_command.raw.data[k]);}
			printf("\n");
			printf("\nreport buffer:\n");
			for (int k=0;k<m_report_length;k++){printf(" %x",m_report.raw.data[k]);}
			printf("\n");
		}


		return 1;
	}


	return 0;
}